

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEditPrivate::ensureVisible(QTextEditPrivate *this,QRectF *_rect)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  bool rtl;
  int visibleHeight;
  int visibleWidth;
  QRect rect;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  QTextEditPrivate *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff60;
  int iVar8;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  
  iVar8 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::toRect((QRectF *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar2 = QWidget::isVisible((QWidget *)0x6cfd48);
  if (bVar2) {
    iVar3 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff50);
    iVar4 = QRect::bottom((QRect *)0x6cfd70);
    if (iVar4 <= iVar3) goto LAB_006cfd7a;
  }
  else {
LAB_006cfd7a:
    bVar2 = QWidget::isVisible((QWidget *)0x6cfd8b);
    if (!bVar2) goto LAB_006cfdc7;
    iVar3 = QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff50);
    iVar4 = QRect::right((QRect *)0x6cfdb3);
    if (iVar4 <= iVar3) goto LAB_006cfdc7;
  }
  adjustScrollbars((QTextEditPrivate *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                  );
LAB_006cfdc7:
  iVar3 = QWidget::width((QWidget *)0x6cfdd8);
  iVar4 = QWidget::height((QWidget *)0x6cfdf2);
  q_func(in_RDI);
  bVar2 = QWidget::isRightToLeft((QWidget *)0x6cfe0b);
  iVar5 = QRect::x((QRect *)0x6cfe21);
  iVar6 = horizontalOffset(in_stack_ffffffffffffff50);
  if (iVar5 < iVar6) {
    if (bVar2) {
      QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff50);
      QRect::x((QRect *)0x6cfe71);
      QAbstractSlider::setValue
                ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 iVar8);
    }
    else {
      QRect::x((QRect *)0x6cfea1);
      QAbstractSlider::setValue
                ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 iVar8);
    }
  }
  else {
    iVar5 = QRect::x((QRect *)0x6cfebf);
    iVar6 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar7 = horizontalOffset(in_stack_ffffffffffffff50);
    if (iVar7 + iVar3 < iVar5 + iVar6) {
      if (bVar2) {
        QAbstractSlider::maximum((QAbstractSlider *)in_stack_ffffffffffffff50);
        QRect::x((QRect *)0x6cff33);
        QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   iVar8);
      }
      else {
        in_stack_ffffffffffffff6c = QRect::x((QRect *)0x6cff83);
        QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        QAbstractSlider::setValue
                  ((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   iVar8);
      }
    }
  }
  iVar3 = QRect::y((QRect *)0x6cffbc);
  iVar5 = verticalOffset((QTextEditPrivate *)0x6cffca);
  if (iVar3 < iVar5) {
    iVar8 = (int)((ulong)(in_RDI->super_QAbstractScrollAreaPrivate).vbar >> 0x20);
    QRect::y((QRect *)0x6cfff2);
    QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff6c,iVar3),iVar8);
  }
  else {
    iVar5 = QRect::y((QRect *)0x6d0010);
    iVar6 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar7 = verticalOffset((QTextEditPrivate *)0x6d0037);
    if (iVar7 + iVar4 < iVar5 + iVar6) {
      iVar4 = QRect::y((QRect *)0x6d0066);
      QRect::height((QRect *)CONCAT44(iVar4,in_stack_ffffffffffffff48));
      QAbstractSlider::setValue((QAbstractSlider *)CONCAT44(in_stack_ffffffffffffff6c,iVar3),iVar8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEditPrivate::ensureVisible(const QRectF &_rect)
{
    const QRect rect = _rect.toRect();
    if ((vbar->isVisible() && vbar->maximum() < rect.bottom())
        || (hbar->isVisible() && hbar->maximum() < rect.right()))
        adjustScrollbars();
    const int visibleWidth = viewport->width();
    const int visibleHeight = viewport->height();
    const bool rtl = q_func()->isRightToLeft();

    if (rect.x() < horizontalOffset()) {
        if (rtl)
            hbar->setValue(hbar->maximum() - rect.x());
        else
            hbar->setValue(rect.x());
    } else if (rect.x() + rect.width() > horizontalOffset() + visibleWidth) {
        if (rtl)
            hbar->setValue(hbar->maximum() - (rect.x() + rect.width() - visibleWidth));
        else
            hbar->setValue(rect.x() + rect.width() - visibleWidth);
    }

    if (rect.y() < verticalOffset())
        vbar->setValue(rect.y());
    else if (rect.y() + rect.height() > verticalOffset() + visibleHeight)
        vbar->setValue(rect.y() + rect.height() - visibleHeight);
}